

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::MultiVertexArrayTest::iterate(MultiVertexArrayTest *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  Primitive PVar3;
  InputType type;
  int iVar4;
  uint uVar5;
  int componentCount;
  int offset;
  int stride;
  int iVar6;
  TestLog *pTVar7;
  ContextArrayPack *pCVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  GLValue min;
  GLValue min_00;
  GLValue max;
  GLValue max_00;
  char cVar14;
  bool bVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  pointer pAVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar22;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  byte bVar23;
  qpTestResult testResult;
  int seed;
  TestContext *this_00;
  long lVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  ArraySpec arraySpec;
  string local_208;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_1c0;
  undefined1 local_1b8 [8];
  undefined3 uStack_1b0;
  undefined4 uStack_1ad;
  undefined1 uStack_1a9;
  char cStack_19c;
  undefined3 uStack_1a8;
  undefined5 uStack_1a5;
  undefined8 uStack_1a0;
  undefined8 local_198;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_190;
  GLValue local_188 [4];
  ios_base local_140 [272];
  
  if (this->m_iteration == 1) {
    VertexArrayTest::compare(&this->super_VertexArrayTest);
    if ((this->super_VertexArrayTest).m_isOk == true) {
      this_00 = (this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx;
      pcVar22 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      bVar15 = isUnalignedBufferOffsetTest(this);
      if (bVar15) {
        this_00 = (this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx;
        pcVar22 = "Failed to draw with unaligned buffers.";
      }
      else {
        bVar15 = isUnalignedBufferStrideTest(this);
        this_00 = (this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx;
        if (!bVar15) {
          pcVar22 = "Image comparison failed.";
          testResult = QP_TEST_RESULT_FAIL;
          goto LAB_0188d5c3;
        }
        pcVar22 = "Failed to draw with unaligned stride.";
      }
      testResult = QP_TEST_RESULT_COMPATIBILITY_WARNING;
    }
LAB_0188d5c3:
    tcu::TestContext::setTestResult(this_00,testResult,pcVar22);
    this->m_iteration = this->m_iteration + 1;
    return STOP;
  }
  if (this->m_iteration != 0) {
    return STOP;
  }
  PVar3 = (this->m_spec).primitive;
  uVar16 = (*((this->super_VertexArrayTest).m_renderCtx)->_vptr_RenderContext[2])();
  pTVar7 = ((this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b8._0_4_ = SUB84(pTVar7,0);
  local_1b8._4_4_ = (undefined4)((ulong)pTVar7 >> 0x20);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
  Spec::getDesc_abi_cxx11_(&local_208,&this->m_spec);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_1b0,local_208._M_dataplus._M_p,local_208._M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
  std::ios_base::~ios_base(local_140);
  pAVar21 = (this->m_spec).arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = pAVar21->inputType;
  uVar10 = pAVar21->outputType;
  uVar11._0_4_ = pAVar21->storage;
  uVar11._4_4_ = pAVar21->usage;
  uVar12._0_4_ = pAVar21->componentCount;
  uVar12._4_4_ = pAVar21->offset;
  uStack_1a0._0_4_ = pAVar21->stride;
  cStack_19c = pAVar21->normalize;
  uStack_1a0._5_3_ = *(undefined3 *)&pAVar21->field_0x1d;
  local_198._0_4_ = (pAVar21->min).type;
  local_198._4_4_ = *(undefined4 *)&(pAVar21->min).field_0x4;
  aStack_190 = (pAVar21->min).field_1;
  local_188[0].type = (pAVar21->max).type;
  local_188[0]._4_4_ = *(undefined4 *)&(pAVar21->max).field_0x4;
  local_188[0].field_1 = (pAVar21->max).field_1;
  uStack_1b0 = (undefined3)(undefined4)uVar11;
  uStack_1ad = (undefined4)((ulong)uVar11 >> 0x18);
  uStack_1a9 = (undefined1)((uint)uVar11._4_4_ >> 0x18);
  uStack_1a8 = (undefined3)(undefined4)uVar12;
  uStack_1a5 = (undefined5)((ulong)uVar12 >> 0x18);
  local_1b8._0_4_ = uVar9;
  local_1b8._4_4_ = uVar10;
  if (uVar9 == 0xb) {
    if (cStack_19c == '\0') {
      fVar29 = 0.001953125;
      goto LAB_0188d010;
    }
  }
  else {
    if (uVar9 != 10) {
      if ((cStack_19c == '\0') ||
         ((fVar29 = 1.0, (uint)uVar9 < 10 && ((0x207U >> (uVar9 & 0x1f) & 1) != 0)))) {
        fVar29 = GLValue::toFloat(local_188);
        fVar29 = 0.9 / fVar29;
      }
      goto LAB_0188d010;
    }
    if (cStack_19c == '\0') {
      fVar29 = 0.0009765625;
      goto LAB_0188d010;
    }
  }
  fVar29 = 1.0;
LAB_0188d010:
  if (((uint)local_1b8._4_4_ < 0xc) && ((0xd8cU >> (local_1b8._4_4_ & 0x1f) & 1) != 0)) {
    fVar29 = fVar29 * 0.5;
  }
  pAVar21 = (this->m_spec).arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->m_spec).arrays.
                          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar21) >> 6) < 2) {
    fVar31 = 1.0;
  }
  else {
    lVar28 = 1;
    lVar24 = 0x40;
    fVar31 = 1.0;
    do {
      puVar1 = (undefined8 *)((long)&pAVar21->inputType + lVar24);
      uVar11 = *puVar1;
      uVar12 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pAVar21->componentCount + lVar24);
      uVar13 = *puVar1;
      uStack_1a0 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pAVar21->min).type + lVar24);
      local_198 = *puVar1;
      aStack_190 = *(anon_union_8_10_1f5805e9_for_GLValue_1 *)(puVar1 + 1);
      puVar1 = (undefined8 *)((long)&(pAVar21->max).type + lVar24);
      local_188[0]._0_8_ = *puVar1;
      local_188[0].field_1 = *(anon_union_8_10_1f5805e9_for_GLValue_1 *)(puVar1 + 1);
      uStack_1a8 = (undefined3)uVar13;
      uStack_1a5 = (undefined5)((ulong)uVar13 >> 0x18);
      local_1b8._0_4_ = (undefined4)uVar11;
      local_1b8._4_4_ = (undefined4)((ulong)uVar11 >> 0x20);
      uStack_1b0 = (undefined3)uVar12;
      uStack_1ad = (undefined4)((ulong)uVar12 >> 0x18);
      uStack_1a9 = (undefined1)((ulong)uVar12 >> 0x38);
      cVar14 = cStack_19c;
      if ((cStack_19c != '\x01') ||
         ((fVar30 = 1.0, (uint)local_1b8._0_4_ < 10 &&
          (fVar30 = 1.0, (0x207U >> (local_1b8._0_4_ & 0x1f) & 1) != 0)))) {
        fVar30 = GLValue::toFloat(local_188);
        fVar30 = 1.0 / fVar30;
      }
      fVar31 = fVar31 * fVar30;
      if (local_1b8._4_4_ == 3) {
        if ((cVar14 == '\0') ||
           ((fVar30 = 1.0, (uint)local_1b8._0_4_ < 10 &&
            (fVar30 = 1.0, (0x207U >> (local_1b8._0_4_ & 0x1f) & 1) != 0)))) {
          fVar30 = GLValue::toFloat(local_188);
          fVar30 = 1.0 / fVar30;
        }
        fVar31 = fVar31 * fVar30;
      }
      lVar28 = lVar28 + 1;
      pAVar21 = (this->m_spec).arrays.
                super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar24 = lVar24 + 0x40;
    } while (lVar28 < (int)((ulong)((long)(this->m_spec).arrays.
                                          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar21
                                   ) >> 6));
  }
  iVar17 = (uint)(PVar3 == PRIMITIVE_TRIANGLES) * 5 + 1;
  pAVar21 = (this->m_spec).arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_spec).arrays.
                              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar21) >> 6)) {
    lVar24 = 0;
    uVar25 = 0;
    do {
      type = *(InputType *)((long)&pAVar21->inputType + lVar24);
      iVar4 = *(int *)((long)&pAVar21->outputType + lVar24);
      uVar5 = *(uint *)((long)&pAVar21->storage + lVar24);
      iVar20 = *(int *)((long)&pAVar21->usage + lVar24);
      componentCount = *(int *)((long)&pAVar21->componentCount + lVar24);
      offset = *(int *)((long)&pAVar21->offset + lVar24);
      stride = *(int *)((long)&pAVar21->stride + lVar24);
      bVar15 = (&pAVar21->normalize)[lVar24];
      uVar11 = *(undefined8 *)(&pAVar21->field_0x1d + lVar24);
      uVar12 = *(undefined8 *)((long)(&pAVar21->field_0x1d + lVar24) + 8);
      local_1b8._0_4_ = (undefined4)uVar11;
      local_1b8._4_4_ = (undefined4)((ulong)uVar11 >> 0x20);
      uStack_1b0 = (undefined3)uVar12;
      uStack_1ad = (undefined4)((ulong)uVar12 >> 0x18);
      uStack_1a8 = (undefined3)
                   ((uint)*(undefined4 *)((long)&(pAVar21->min).field_1 + lVar24 + 4) >> 8);
      uStack_1a9 = (undefined1)((ulong)uVar12 >> 0x38);
      puVar2 = (undefined4 *)((long)&(pAVar21->max).type + lVar24);
      local_1e8 = *puVar2;
      uStack_1e4 = puVar2[1];
      uStack_1e0 = puVar2[2];
      uStack_1dc = puVar2[3];
      iVar26 = stride;
      if (stride == 0) {
        iVar26 = Array::inputTypeSize::size[(int)type] * componentCount;
      }
      PVar3 = (this->m_spec).primitive;
      iVar27 = (this->m_spec).drawCount;
      iVar6 = Array::inputTypeSize::size[(int)type];
      iVar18 = (*((this->super_VertexArrayTest).m_renderCtx)->_vptr_RenderContext[4])();
      iVar18 = *(int *)CONCAT44(extraout_var,iVar18);
      iVar19 = (*((this->super_VertexArrayTest).m_renderCtx)->_vptr_RenderContext[4])();
      iVar19 = *(int *)(CONCAT44(extraout_var_00,iVar19) + 4);
      if (iVar18 < iVar19) {
        iVar19 = iVar18;
      }
      if ((this->m_spec).primitive == PRIMITIVE_TRIANGLES) {
        seed = (bVar15 & 1) + stride + PVar3 * 1000 + iVar27 +
               iVar20 * 10000 + uVar5 * 100 + type + iVar4 * 10 + componentCount * 0xc;
        iVar18 = (this->m_spec).drawCount;
        if (uVar25 == 0) {
          local_1c8 = CONCAT35(uStack_1b0,CONCAT41(local_1b8._4_4_,local_1b8[3]));
          aStack_1c0._4_4_ = _uStack_1a9;
          aStack_1c0.fl.m_value = (Float)(Float)uStack_1ad;
          max_00._4_4_ = uStack_1e4;
          max_00.type = local_1e8;
          max_00.field_1._4_4_ = uStack_1dc;
          max_00.field_1.fl.m_value = (Float)(Float)uStack_1e0;
          min_00._4_4_ = (int)((ulong)local_1c8 >> 0x20);
          min_00.type = (int)CONCAT41(local_1b8._4_4_,local_1b8[3]);
          min_00.field_1 = aStack_1c0;
          pcVar22 = RandomArrayGenerator::generateQuads
                              (seed,iVar18,componentCount,offset,stride,PRIMITIVE_TRIANGLES,type,
                               min_00,max_00,3.0 / (float)(iVar19 + -1));
        }
        else {
          local_1d8 = CONCAT35(uStack_1b0,CONCAT41(local_1b8._4_4_,local_1b8[3]));
          uStack_1d0 = CONCAT44(_uStack_1a9,uStack_1ad);
          max._4_4_ = uStack_1e4;
          max.type = local_1e8;
          max.field_1._4_4_ = uStack_1dc;
          max.field_1.fl.m_value = (Float)(Float)uStack_1e0;
          min._4_4_ = (int)((ulong)local_1d8 >> 0x20);
          min.type = (int)CONCAT41(local_1b8._4_4_,local_1b8[3]);
          min.field_1.fl.m_value = (Float)(Float)uStack_1ad;
          min.field_1._4_4_ = _uStack_1a9;
          pcVar22 = RandomArrayGenerator::generatePerQuad
                              (seed,iVar18,componentCount,stride,PRIMITIVE_TRIANGLES,type,min,max);
        }
      }
      else {
        pcVar22 = (char *)0x0;
      }
      iVar27 = iVar26 * (iVar27 * iVar17 + -1) + offset + iVar6 * componentCount;
      pCVar8 = (this->super_VertexArrayTest).m_glArrayPack;
      (*pCVar8->_vptr_ContextArrayPack[4])(pCVar8,(ulong)uVar5);
      pCVar8 = (this->super_VertexArrayTest).m_rrArrayPack;
      (*pCVar8->_vptr_ContextArrayPack[4])(pCVar8,(ulong)uVar5);
      pCVar8 = (this->super_VertexArrayTest).m_glArrayPack;
      iVar26 = (*pCVar8->_vptr_ContextArrayPack[2])(pCVar8,uVar25 & 0xffffffff);
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar26) + 0x10))
                ((long *)CONCAT44(extraout_var_01,iVar26),1,iVar27,pcVar22,iVar20);
      pCVar8 = (this->super_VertexArrayTest).m_rrArrayPack;
      iVar26 = (*pCVar8->_vptr_ContextArrayPack[2])(pCVar8,uVar25 & 0xffffffff);
      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar26) + 0x10))
                ((long *)CONCAT44(extraout_var_02,iVar26),1,iVar27,pcVar22,iVar20);
      pCVar8 = (this->super_VertexArrayTest).m_glArrayPack;
      iVar20 = (*pCVar8->_vptr_ContextArrayPack[2])(pCVar8,uVar25 & 0xffffffff);
      bVar23 = bVar15 & 1;
      (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar20) + 0x20))
                ((long *)CONCAT44(extraout_var_03,iVar20),uVar25 & 0xffffffff,offset,componentCount,
                 type,iVar4,bVar23,stride);
      pCVar8 = (this->super_VertexArrayTest).m_rrArrayPack;
      iVar20 = (*pCVar8->_vptr_ContextArrayPack[2])(pCVar8,uVar25 & 0xffffffff);
      (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar20) + 0x20))
                ((long *)CONCAT44(extraout_var_04,iVar20),uVar25 & 0xffffffff,offset,componentCount,
                 type,iVar4,bVar23,stride);
      if (pcVar22 != (char *)0x0) {
        operator_delete__(pcVar22);
      }
      uVar25 = uVar25 + 1;
      pAVar21 = (this->m_spec).arrays.
                super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar24 = lVar24 + 0x40;
    } while ((long)uVar25 <
             (long)(int)((ulong)((long)(this->m_spec).arrays.
                                       super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar21)
                        >> 6));
  }
  pCVar8 = (this->super_VertexArrayTest).m_glArrayPack;
  (*pCVar8->_vptr_ContextArrayPack[5])
            (fVar29,fVar31,pCVar8,(ulong)(this->m_spec).primitive,(ulong)(uint)(this->m_spec).first,
             (ulong)(uint)((this->m_spec).drawCount * iVar17),(ulong)((uVar16 & 0x300) == 0x100));
  pCVar8 = (this->super_VertexArrayTest).m_rrArrayPack;
  (*pCVar8->_vptr_ContextArrayPack[5])
            (fVar29,fVar31,pCVar8,(ulong)(this->m_spec).primitive,(ulong)(uint)(this->m_spec).first,
             (ulong)(uint)(iVar17 * (this->m_spec).drawCount),(ulong)((uVar16 & 0x300) == 0x100));
  this->m_iteration = this->m_iteration + 1;
  return CONTINUE;
}

Assistant:

MultiVertexArrayTest::IterateResult MultiVertexArrayTest::iterate (void)
{
	if (m_iteration == 0)
	{
		const size_t	primitiveSize		= (m_spec.primitive == Array::PRIMITIVE_TRIANGLES) ? (6) : (1); // in non-indexed draw Triangles means rectangles
		float			coordScale			= 1.0f;
		float			colorScale			= 1.0f;
		const bool		useVao				= m_renderCtx.getType().getProfile() == glu::PROFILE_CORE;

		// Log info
		m_testCtx.getLog() << TestLog::Message << m_spec.getDesc() << TestLog::EndMessage;

		// Color and Coord scale
		{
			// First array is always position
			{
				Spec::ArraySpec arraySpec = m_spec.arrays[0];
				if (arraySpec.inputType == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10)
				{
					if (arraySpec.normalize)
						coordScale = 1.0f;
					else
						coordScale = 1.0 / 1024.0;
				}
				else if (arraySpec.inputType == Array::INPUTTYPE_INT_2_10_10_10)
				{
					if (arraySpec.normalize)
						coordScale = 1.0f;
					else
						coordScale = 1.0 / 512.0;
				}
				else
					coordScale = (arraySpec.normalize && !inputTypeIsFloatType(arraySpec.inputType) ? 1.0f : float(0.9 / double(arraySpec.max.toFloat())));

				if (arraySpec.outputType == Array::OUTPUTTYPE_VEC3 || arraySpec.outputType == Array::OUTPUTTYPE_VEC4
					|| arraySpec.outputType == Array::OUTPUTTYPE_IVEC3 || arraySpec.outputType == Array::OUTPUTTYPE_IVEC4
					|| arraySpec.outputType == Array::OUTPUTTYPE_UVEC3 || arraySpec.outputType == Array::OUTPUTTYPE_UVEC4)
						coordScale = coordScale * 0.5f;
			}

			// And other arrays are color-like
			for (int arrayNdx = 1; arrayNdx < (int)m_spec.arrays.size(); arrayNdx++)
			{
				Spec::ArraySpec arraySpec	= m_spec.arrays[arrayNdx];

				colorScale *= (arraySpec.normalize && !inputTypeIsFloatType(arraySpec.inputType) ? 1.0f : float(1.0 / double(arraySpec.max.toFloat())));
				if (arraySpec.outputType == Array::OUTPUTTYPE_VEC4)
					colorScale *= (arraySpec.normalize && !inputTypeIsFloatType(arraySpec.inputType) ? 1.0f : float(1.0 / double(arraySpec.max.toFloat())));
			}
		}

		// Data
		for (int arrayNdx = 0; arrayNdx < (int)m_spec.arrays.size(); arrayNdx++)
		{
			Spec::ArraySpec arraySpec		= m_spec.arrays[arrayNdx];
			const int		seed			= int(arraySpec.inputType) + 10 * int(arraySpec.outputType) + 100 * int(arraySpec.storage) + 1000 * int(m_spec.primitive) + 10000 * int(arraySpec.usage) + int(m_spec.drawCount) + 12 * int(arraySpec.componentCount) + int(arraySpec.stride) + int(arraySpec.normalize);
			const char*		data			= DE_NULL;
			const size_t	stride			= (arraySpec.stride == 0) ? (arraySpec.componentCount * Array::inputTypeSize(arraySpec.inputType)) : (arraySpec.stride);
			const size_t	bufferSize		= arraySpec.offset + stride * (m_spec.drawCount * primitiveSize - 1) + arraySpec.componentCount  * Array::inputTypeSize(arraySpec.inputType);
			// Snap values to at least 3x3 grid
			const float		gridSize		= 3.0f / (float)(de::min(m_renderCtx.getRenderTarget().getWidth(), m_renderCtx.getRenderTarget().getHeight()) - 1);

			switch (m_spec.primitive)
			{
	//			case Array::PRIMITIVE_POINTS:
	//				data = RandomArrayGenerator::generateArray(seed, arraySpec.min, arraySpec.max, arraySpec.count, arraySpec.componentCount, arraySpec.stride, arraySpec.inputType);
	//				break;
				case Array::PRIMITIVE_TRIANGLES:
					if (arrayNdx == 0)
					{
						data = RandomArrayGenerator::generateQuads(seed, m_spec.drawCount, arraySpec.componentCount, arraySpec.offset, arraySpec.stride, m_spec.primitive, arraySpec.inputType, arraySpec.min, arraySpec.max, gridSize);
					}
					else
					{
						DE_ASSERT(arraySpec.offset == 0); // \note [jarkko] it just hasn't been implemented
						data = RandomArrayGenerator::generatePerQuad(seed, m_spec.drawCount, arraySpec.componentCount, arraySpec.stride, m_spec.primitive, arraySpec.inputType, arraySpec.min, arraySpec.max);
					}
					break;

				default:
					DE_ASSERT(false);
					break;
			}

			m_glArrayPack->newArray(arraySpec.storage);
			m_rrArrayPack->newArray(arraySpec.storage);

			m_glArrayPack->getArray(arrayNdx)->data(Array::TARGET_ARRAY, (int)bufferSize, data, arraySpec.usage);
			m_rrArrayPack->getArray(arrayNdx)->data(Array::TARGET_ARRAY, (int)bufferSize, data, arraySpec.usage);

			m_glArrayPack->getArray(arrayNdx)->bind(arrayNdx, arraySpec.offset, arraySpec.componentCount, arraySpec.inputType, arraySpec.outputType, arraySpec.normalize, arraySpec.stride);
			m_rrArrayPack->getArray(arrayNdx)->bind(arrayNdx, arraySpec.offset, arraySpec.componentCount, arraySpec.inputType, arraySpec.outputType, arraySpec.normalize, arraySpec.stride);

			delete [] data;
		}

		try
		{
			m_glArrayPack->render(m_spec.primitive, m_spec.first, m_spec.drawCount * (int)primitiveSize, useVao, coordScale, colorScale);
			m_rrArrayPack->render(m_spec.primitive, m_spec.first, m_spec.drawCount * (int)primitiveSize, useVao, coordScale, colorScale);
		}
		catch (glu::Error& err)
		{
			// GL Errors are ok if the mode is not properly aligned

			m_testCtx.getLog() << TestLog::Message << "Got error: " << err.what() << TestLog::EndMessage;

			if (isUnalignedBufferOffsetTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (isUnalignedBufferStrideTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				throw;

			return STOP;
		}

		m_iteration++;
		return CONTINUE;
	}
	else if (m_iteration == 1)
	{
		compare();

		if (m_isOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			if (isUnalignedBufferOffsetTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (isUnalignedBufferStrideTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed.");
		}

		m_iteration++;
		return STOP;
	}
	else
	{
		DE_ASSERT(false);
		return STOP;
	}
}